

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O0

bool __thiscall despot::Pocman::HearGhost(Pocman *this,PocmanState *pocstate)

{
  int iVar1;
  const_reference pvVar2;
  int local_24;
  int g;
  PocmanState *pocstate_local;
  Pocman *this_local;
  
  local_24 = 0;
  while( true ) {
    if (this->num_ghosts_ <= local_24) {
      return false;
    }
    pvVar2 = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator[]
                       (&pocstate->ghost_pos,(long)local_24);
    iVar1 = despot::Coord::ManhattanDistance
                      (*(undefined8 *)pvVar2,*(undefined8 *)&pocstate->pocman_pos);
    if (iVar1 <= this->hear_range_) break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

bool Pocman::HearGhost(const PocmanState& pocstate) const {
	for (int g = 0; g < num_ghosts_; g++)
		if (Coord::ManhattanDistance(pocstate.ghost_pos[g], pocstate.pocman_pos)
			<= hear_range_)
			return true;
	return false;
}